

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O0

void __thiscall QAbstractSocketPrivate::~QAbstractSocketPrivate(QAbstractSocketPrivate *this)

{
  QAbstractSocketPrivate *in_RDI;
  
  ~QAbstractSocketPrivate(in_RDI);
  operator_delete(in_RDI,0x270);
  return;
}

Assistant:

QAbstractSocketPrivate::~QAbstractSocketPrivate()
{
}